

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.cpp
# Opt level: O0

void __thiscall Cube::setup_cube(Cube *this)

{
  Cube *this_local;
  
  (*glad_glGenVertexArrays)(1,&this->VAO);
  (*glad_glGenBuffers)(1,&this->VBO);
  (*glad_glBindVertexArray)(this->VAO);
  (*glad_glBindBuffer)(0x8892,this->VBO);
  (*glad_glBufferData)(0x8892,0x360,cube_vertices,0x88e4);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0xc,(void *)0x0);
  (*glad_glBindVertexArray)(0);
  return;
}

Assistant:

void Cube::setup_cube(){
  glGenVertexArrays(1, &VAO);
  glGenBuffers(1, &VBO);

  glBindVertexArray(VAO);
  glBindBuffer(GL_ARRAY_BUFFER, VBO);
  glBufferData(GL_ARRAY_BUFFER, sizeof(cube_vertices), cube_vertices,
               GL_STATIC_DRAW);

  // vertex attributes, {coordinates}
  glEnableVertexAttribArray(0);
  glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 3 * sizeof(float), (void *)0);

  // unbind vao so other objects can be bound later
  glBindVertexArray(0);
}